

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O3

_Bool adt_list_remove(adt_list_t *self,void *pItem)

{
  adt_list_elem_tag *pIter;
  
  if ((self != (adt_list_t *)0x0) && (pIter = self->pFirst, pIter != (adt_list_elem_t *)0x0)) {
    do {
      if (pIter->pItem == pItem) {
        adt_list_erase(self,pIter);
        return true;
      }
      pIter = pIter->pNext;
    } while (pIter != (adt_list_elem_tag *)0x0);
    return false;
  }
  return false;
}

Assistant:

bool adt_list_remove(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *iter = adt_list_find(self, pItem);
      if (iter == 0)
      {
         return false;
      }
      else
      {
         adt_list_erase(self, iter);
         return true;
      }
   }
   return false;
}